

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O0

bool tao::pegtl::internal::
     duseltronik<tao::pegtl::seq<ovf::detail::parse::v2::end,tao::pegtl::ascii::istring<(char)68,(char)97,(char)116,(char)97,(char)32,(char)66,(char)105,(char)110,(char)97,(char)114,(char)121,(char)32,(char)52>,tao::pegtl::ascii::eol>,(tao::pegtl::apply_mode)0,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_data_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)1>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,double*&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *st,ovf_segment *st_1,double **st_2)

{
  bool bVar1;
  double **st_local_2;
  ovf_segment *st_local_1;
  ovf_file *st_local;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_local;
  
  normal<tao::pegtl::seq<ovf::detail::parse::v2::end,tao::pegtl::ascii::istring<(char)68,(char)97,(char)116,(char)97,(char)32,(char)66,(char)105,(char)110,(char)97,(char)114,(char)121,(char)32,(char)52>,tao::pegtl::ascii::eol>>
  ::
  start<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,double*&>
            (in,st,st_1,st_2);
  bVar1 = duseltronik<tao::pegtl::seq<ovf::detail::parse::v2::end,tao::pegtl::ascii::istring<(char)68,(char)97,(char)116,(char)97,(char)32,(char)66,(char)105,(char)110,(char)97,(char)114,(char)121,(char)32,(char)52>,tao::pegtl::ascii::eol>,(tao::pegtl::apply_mode)0,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_data_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)0>
          ::
          match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,double*&>
                    (in,st,st_1,st_2);
  if (bVar1) {
    normal<tao::pegtl::seq<ovf::detail::parse::v2::end,tao::pegtl::ascii::istring<(char)68,(char)97,(char)116,(char)97,(char)32,(char)66,(char)105,(char)110,(char)97,(char)114,(char)121,(char)32,(char)52>,tao::pegtl::ascii::eol>>
    ::
    success<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,double*&>
              (in,st,st_1,st_2);
  }
  else {
    normal<tao::pegtl::seq<ovf::detail::parse::v2::end,tao::pegtl::ascii::istring<(char)68,(char)97,(char)116,(char)97,(char)32,(char)66,(char)105,(char)110,(char)97,(char)114,(char)121,(char)32,(char)52>,tao::pegtl::ascii::eol>>
    ::
    failure<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,double*&>
              (in,st,st_1,st_2);
  }
  return bVar1;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, M, Action, Control, dusel_mode::nothing >::match( in, st... ) ) {
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return true;
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }